

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
BCL::
Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
::get(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
     Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
     *this)

{
  size_t in_R8;
  GlobalPtr<const_char> src;
  serial_ptr<char> local;
  serial_ptr<char> local_30;
  
  if ((this->ptr).ptr == 0 && (this->ptr).rank == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    serial_ptr<char>::serial_ptr(&local_30,this->len);
    src.ptr = (size_t)local_30.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    src.rank = (this->ptr).ptr;
    read<char>((BCL *)(this->ptr).rank,src,(char *)this->len,in_R8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               local_30.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               local_30.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + local_30.N
              );
    if (local_30.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T get() const {
      if (ptr != nullptr) {
        serial_ptr <SPT> local(len);
        BCL::rget(this->ptr, local.ptr.get(), len);
        return Serialize{}.deserialize(local);
      } else {
        return T();
      }
    }